

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeArray(ExpressionContext *ctx,SynArray *syntax)

{
  TypeBase *type;
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  ExprBase **ppEVar7;
  TypeUnsizedArray *type_00;
  ExprError *value;
  undefined4 extraout_var;
  TypeBase *pTVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var_00;
  TypeArray *pTVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar11;
  SynBase *pSVar12;
  uint i;
  TypeBase *pTVar13;
  IntrusiveList<ExprBase> values;
  SmallArray<ExprBase_*,_64U> raw;
  ExprError *this;
  
  pSVar12 = (syntax->values).head;
  if (pSVar12 == (SynBase *)0x0) {
    __assert_fail("syntax->values.head",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xf28,"ExprBase *AnalyzeArray(ExpressionContext &, SynArray *)");
  }
  raw.allocator = ctx->allocator;
  raw.data = raw.little;
  raw.count = 0;
  raw.max = 0x40;
  type_00 = (TypeUnsizedArray *)0x0;
  for (; pSVar12 != (SynBase *)0x0; pSVar12 = pSVar12->next) {
    values.head = AnalyzeExpression(ctx,pSVar12);
    if ((raw.count != 0) &&
       (ppEVar7 = SmallArray<ExprBase_*,_64U>::operator[](&raw,0),
       (*ppEVar7)->type != (values.head)->type)) {
      ppEVar7 = SmallArray<ExprBase_*,_64U>::operator[](&raw,0);
      pTVar8 = (*ppEVar7)->type;
      if ((pTVar8 != (TypeBase *)0x0) && (pTVar8->typeID == 0x13)) {
        type_00 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar8[1]._vptr_TypeBase);
      }
    }
    SmallArray<ExprBase_*,_64U>::push_back(&raw,&values.head);
  }
  if (raw.count != 0) {
    ppEVar7 = SmallArray<ExprBase_*,_64U>::operator[](&raw,0);
    if (((*ppEVar7)->type != (TypeBase *)0x0) && ((*ppEVar7)->type->typeID == 0)) {
      values.head = (ExprBase *)0x0;
      values.tail = (ExprBase *)0x0;
      for (uVar11 = 0; uVar11 < raw.count; uVar11 = uVar11 + 1) {
        ppEVar7 = SmallArray<ExprBase_*,_64U>::operator[](&raw,uVar11);
        IntrusiveList<ExprBase>::push_back(&values,*ppEVar7);
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
      pTVar10 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
      goto LAB_00150771;
    }
  }
  values.head = (ExprBase *)0x0;
  values.tail = (ExprBase *)0x0;
  pTVar8 = (TypeBase *)0x0;
  for (uVar11 = 0; uVar11 < raw.count; uVar11 = uVar11 + 1) {
    ppEVar7 = SmallArray<ExprBase_*,_64U>::operator[](&raw,uVar11);
    value = (ExprError *)*ppEVar7;
    if (type_00 != (TypeUnsizedArray *)0x0) {
      value = (ExprError *)
              CreateCast(ctx,(value->super_ExprBase).source,(ExprBase *)value,(TypeBase *)type_00,
                         false);
    }
    type = (value->super_ExprBase).type;
    pTVar13 = type;
    if ((pTVar8 != (TypeBase *)0x0) && (pTVar13 = pTVar8, pTVar8 != type)) {
      bVar5 = ExpressionContext::IsIntegerType(ctx,type);
      pTVar1 = ctx->typeFloat;
      pTVar2 = ctx->typeDouble;
      if ((bVar5) &&
         ((pTVar2 == pTVar8 || pTVar1 == pTVar8 ||
          ((bVar5 = ExpressionContext::IsIntegerType(ctx,pTVar8), bVar5 &&
           (type->size < pTVar8->size)))))) {
LAB_00150600:
        value = (ExprError *)
                CreateCast(ctx,(value->super_ExprBase).source,&value->super_ExprBase,pTVar8,false);
      }
      else {
        if ((pTVar2 == type || pTVar1 == type) && (pTVar2 == pTVar8 || pTVar1 == pTVar8)) {
          if (type->size < pTVar8->size) goto LAB_00150600;
LAB_0015062a:
          if (type->typeID == 0) goto LAB_00150684;
        }
        else if (type != (TypeBase *)0x0) goto LAB_0015062a;
        pcVar3 = (type->name).begin;
        pcVar4 = (pTVar8->name).begin;
        value = anon_unknown.dwarf_94284::ReportExpected
                          (ctx,(value->super_ExprBase).source,type,
                           "ERROR: array element %d type \'%.*s\' doesn\'t match \'%.*s\'",
                           (ulong)(uVar11 + 1),
                           (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3,
                           (ulong)(uint)(*(int *)&(pTVar8->name).end - (int)pcVar4),pcVar4);
      }
    }
LAB_00150684:
    pSVar12 = (value->super_ExprBase).source;
    if ((value->super_ExprBase).type == ctx->typeVoid) {
      anon_unknown.dwarf_94284::Stop
                (ctx,pSVar12,"ERROR: array cannot be constructed from void type elements");
    }
    bVar5 = AssertValueExpression(ctx,pSVar12,&value->super_ExprBase);
    this = value;
    if (!bVar5) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      this = (ExprError *)CONCAT44(extraout_var,iVar6);
      pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError(this,&syntax->super_SynBase,pTVar8,&value->super_ExprBase);
    }
    IntrusiveList<ExprBase>::push_back(&values,&this->super_ExprBase);
    pTVar8 = pTVar13;
  }
  if (values.head != (ExprBase *)0x0) {
    pEVar9 = IntrusiveList<ExprBase>::operator[](&values,0);
    if ((pEVar9->type != (TypeBase *)0x0) && (pEVar9->type->typeID == 0)) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar6);
      pTVar10 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
      goto LAB_00150771;
    }
  }
  if (((pTVar8 != (TypeBase *)0x0) && (pTVar8->typeID == 0x18)) &&
     (*(char *)((long)&pTVar8[3]._vptr_TypeBase + 2) == '\x01')) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
               ,(ulong)(uint)(*(int *)&(pTVar8->name).end - (int)(pTVar8->name).begin));
  }
  if (0xffff < pTVar8->size) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,"ERROR: array element size cannot exceed 65535 bytes");
  }
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
  uVar11 = IntrusiveList<ExprBase>::size(&values);
  pTVar10 = ExpressionContext::GetArrayType(ctx,pTVar8,(ulong)uVar11);
LAB_00150771:
  pEVar9->typeID = 0xf;
  pEVar9->source = &syntax->super_SynBase;
  pEVar9->type = &pTVar10->super_TypeBase;
  pEVar9->next = (ExprBase *)0x0;
  pEVar9->listed = false;
  pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223c18;
  pEVar9[1]._vptr_ExprBase = (_func_int **)values.head;
  *(ExprBase **)&pEVar9[1].typeID = values.tail;
  SmallArray<ExprBase_*,_64U>::~SmallArray(&raw);
  return pEVar9;
}

Assistant:

ExprBase* AnalyzeArray(ExpressionContext &ctx, SynArray *syntax)
{
	assert(syntax->values.head);

	SmallArray<ExprBase*, 64> raw(ctx.allocator);

	TypeBase *nestedUnsizedType = NULL;

	for(SynBase *el = syntax->values.head; el; el = el->next)
	{
		ExprBase *value = AnalyzeExpression(ctx, el);

		if(!raw.empty() && raw[0]->type != value->type)
		{
			if(TypeArray *arrayType = getType<TypeArray>(raw[0]->type))
				nestedUnsizedType = ctx.GetUnsizedArrayType(arrayType->subType);
		}

		raw.push_back(value);
	}

	// First value type is required to complete array definition
	if(!raw.empty() && isType<TypeError>(raw[0]->type))
	{
		IntrusiveList<ExprBase> values;

		for(unsigned i = 0; i < raw.size(); i++)
			values.push_back(raw[i]);

		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);
	}

	IntrusiveList<ExprBase> values;

	TypeBase *subType = NULL;

	for(unsigned i = 0; i < raw.size(); i++)
	{
		ExprBase *value = raw[i];

		if(nestedUnsizedType)
			value = CreateCast(ctx, value->source, value, nestedUnsizedType, false);

		if(subType == NULL)
		{
			subType = value->type;
		}
		else if(subType != value->type)
		{
			// Allow numeric promotion
			if(ctx.IsIntegerType(value->type) && ctx.IsFloatingPointType(subType))
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsIntegerType(value->type) && ctx.IsIntegerType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsFloatingPointType(value->type) && ctx.IsFloatingPointType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(!isType<TypeError>(value->type))
				value = ReportExpected(ctx, value->source, value->type, "ERROR: array element %d type '%.*s' doesn't match '%.*s'", i + 1, FMT_ISTR(value->type->name), FMT_ISTR(subType->name));
		}

		if(value->type == ctx.typeVoid)
			Stop(ctx, value->source, "ERROR: array cannot be constructed from void type elements");

		if(!AssertValueExpression(ctx, value->source, value))
			value = new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

		values.push_back(value);
	}

	if(!values.empty() && isType<TypeError>(values[0]->type))
		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);

	if(TypeClass *typeClass = getType<TypeClass>(subType))
	{
		if(typeClass->hasFinalizer)
			Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(subType->name));
	}

	if(subType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetArrayType(subType, values.size()), values);
}